

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int ly_strequal_(char *s1,char *s2)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  
  iVar2 = 1;
  if (s1 != s2) {
    if ((s2 != (char *)0x0 && s1 != (char *)0x0) && (cVar3 = *s1, cVar3 == *s2)) {
      lVar4 = 1;
      do {
        if (cVar3 == '\0') {
          return 1;
        }
        cVar3 = s1[lVar4];
        pcVar1 = s2 + lVar4;
        lVar4 = lVar4 + 1;
      } while (cVar3 == *pcVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
ly_strequal_(const char *s1, const char *s2)
{
    if (s1 == s2) {
        return 1;
    } else if (!s1 || !s2) {
        return 0;
    } else {
        for ( ; *s1 == *s2; s1++, s2++) {
            if (*s1 == '\0') {
                return 1;
            }
        }
        return 0;
    }
}